

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling3d.cpp
# Opt level: O3

void __thiscall
ncnn::Pooling3D::make_padding
          (Pooling3D *this,Mat *bottom_blob,Mat *bottom_blob_bordered,Option *opt)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int front;
  float v;
  Option opt_b;
  
  iVar7 = bottom_blob->w;
  iVar2 = bottom_blob->h;
  iVar4 = bottom_blob->d;
  if (bottom_blob_bordered != bottom_blob) {
    piVar1 = bottom_blob->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = bottom_blob_bordered->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (bottom_blob_bordered->allocator == (Allocator *)0x0) {
          if (bottom_blob_bordered->data != (void *)0x0) {
            free(bottom_blob_bordered->data);
          }
        }
        else {
          (*bottom_blob_bordered->allocator->_vptr_Allocator[3])();
        }
      }
    }
    bottom_blob_bordered->cstep = 0;
    bottom_blob_bordered->data = (void *)0x0;
    bottom_blob_bordered->refcount = (int *)0x0;
    *(undefined8 *)((long)&bottom_blob_bordered->refcount + 4) = 0;
    *(undefined8 *)((long)&bottom_blob_bordered->elemsize + 4) = 0;
    bottom_blob_bordered->dims = 0;
    bottom_blob_bordered->w = 0;
    bottom_blob_bordered->h = 0;
    bottom_blob_bordered->d = 0;
    bottom_blob_bordered->c = 0;
    piVar1 = bottom_blob->refcount;
    bottom_blob_bordered->data = bottom_blob->data;
    bottom_blob_bordered->refcount = piVar1;
    bottom_blob_bordered->elemsize = bottom_blob->elemsize;
    bottom_blob_bordered->elempack = bottom_blob->elempack;
    bottom_blob_bordered->allocator = bottom_blob->allocator;
    iVar5 = bottom_blob->w;
    iVar3 = bottom_blob->h;
    iVar6 = bottom_blob->d;
    bottom_blob_bordered->dims = bottom_blob->dims;
    bottom_blob_bordered->w = iVar5;
    bottom_blob_bordered->h = iVar3;
    bottom_blob_bordered->d = iVar6;
    bottom_blob_bordered->c = bottom_blob->c;
    bottom_blob_bordered->cstep = bottom_blob->cstep;
  }
  v = 0.0;
  if (this->pooling_type == 0) {
    v = *(float *)(&DAT_005ab368 + (ulong)(bottom_blob->elemsize == 1) * 4);
  }
  switch(this->pad_mode) {
  case 0:
    iVar5 = this->pad_left;
    iVar3 = ((iVar7 + iVar5 + this->pad_right) - this->kernel_w) % this->stride_w;
    iVar7 = this->pad_top;
    iVar2 = ((iVar2 + iVar7 + this->pad_bottom) - this->kernel_h) % this->stride_h;
    front = this->pad_front;
    iVar4 = ((iVar4 + front + this->pad_behind) - this->kernel_d) % this->stride_d;
    iVar6 = this->stride_w - iVar3;
    if (iVar3 == 0) {
      iVar6 = 0;
    }
    iVar3 = this->stride_h - iVar2;
    if (iVar2 == 0) {
      iVar3 = 0;
    }
    iVar2 = this->stride_d - iVar4;
    if (iVar4 == 0) {
      iVar2 = 0;
    }
    opt_b.lightmode = opt->lightmode;
    opt_b.use_shader_pack8 = opt->use_shader_pack8;
    opt_b.use_subgroup_ops = opt->use_subgroup_ops;
    opt_b.use_reserved_0 = opt->use_reserved_0;
    opt_b.num_threads = opt->num_threads;
    opt_b.workspace_allocator = opt->workspace_allocator;
    opt_b.openmp_blocktime = opt->openmp_blocktime;
    opt_b.use_winograd_convolution = opt->use_winograd_convolution;
    opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_b.use_int8_inference = opt->use_int8_inference;
    opt_b.use_vulkan_compute = opt->use_vulkan_compute;
    opt_b.use_bf16_storage = opt->use_bf16_storage;
    opt_b.use_fp16_packed = opt->use_fp16_packed;
    opt_b.use_fp16_storage = opt->use_fp16_storage;
    opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_b.use_int8_packed = opt->use_int8_packed;
    opt_b.use_int8_storage = opt->use_int8_storage;
    opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_b.use_packing_layout = opt->use_packing_layout;
    opt_b.vulkan_device_index = opt->vulkan_device_index;
    opt_b.use_reserved_1 = opt->use_reserved_1;
    opt_b.use_image_storage = opt->use_image_storage;
    opt_b.use_tensor_storage = opt->use_tensor_storage;
    opt_b.use_reserved_2 = opt->use_reserved_2;
    opt_b.flush_denormals = opt->flush_denormals;
    opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_b.use_shader_local_memory = opt->use_shader_local_memory;
    opt_b.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_b.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_b.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_b.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_b.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_b.use_fp16_uniform = opt->use_fp16_uniform;
    opt_b.use_int8_uniform = opt->use_int8_uniform;
    opt_b.use_reserved_9 = opt->use_reserved_9;
    opt_b.use_reserved_10 = opt->use_reserved_10;
    opt_b.use_reserved_11 = opt->use_reserved_11;
    opt_b.blob_allocator = opt->workspace_allocator;
    iVar3 = iVar3 + this->pad_bottom;
    iVar6 = iVar6 + this->pad_right;
    iVar2 = iVar2 + this->pad_behind;
    break;
  case 1:
    opt_b.lightmode = opt->lightmode;
    opt_b.use_shader_pack8 = opt->use_shader_pack8;
    opt_b.use_subgroup_ops = opt->use_subgroup_ops;
    opt_b.use_reserved_0 = opt->use_reserved_0;
    opt_b.num_threads = opt->num_threads;
    opt_b.workspace_allocator = opt->workspace_allocator;
    opt_b.openmp_blocktime = opt->openmp_blocktime;
    opt_b.use_winograd_convolution = opt->use_winograd_convolution;
    opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_b.use_int8_inference = opt->use_int8_inference;
    opt_b.use_vulkan_compute = opt->use_vulkan_compute;
    opt_b.use_bf16_storage = opt->use_bf16_storage;
    opt_b.use_fp16_packed = opt->use_fp16_packed;
    opt_b.use_fp16_storage = opt->use_fp16_storage;
    opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_b.use_int8_packed = opt->use_int8_packed;
    opt_b.use_int8_storage = opt->use_int8_storage;
    opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_b.use_packing_layout = opt->use_packing_layout;
    opt_b.vulkan_device_index = opt->vulkan_device_index;
    opt_b.use_reserved_1 = opt->use_reserved_1;
    opt_b.use_image_storage = opt->use_image_storage;
    opt_b.use_tensor_storage = opt->use_tensor_storage;
    opt_b.use_reserved_2 = opt->use_reserved_2;
    opt_b.flush_denormals = opt->flush_denormals;
    opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_b.use_shader_local_memory = opt->use_shader_local_memory;
    opt_b.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_b.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_b.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_b.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_b.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_b.use_fp16_uniform = opt->use_fp16_uniform;
    opt_b.use_int8_uniform = opt->use_int8_uniform;
    opt_b.use_reserved_9 = opt->use_reserved_9;
    opt_b.use_reserved_10 = opt->use_reserved_10;
    opt_b.use_reserved_11 = opt->use_reserved_11;
    opt_b.blob_allocator = opt->workspace_allocator;
    iVar7 = this->pad_top;
    iVar3 = this->pad_bottom;
    iVar5 = this->pad_left;
    iVar6 = this->pad_right;
    front = this->pad_front;
    iVar2 = this->pad_behind;
    break;
  case 2:
    iVar6 = ~((iVar7 + -1) % this->stride_w) + this->kernel_w;
    iVar3 = ~((iVar2 + -1) % this->stride_h) + this->kernel_h;
    iVar2 = ~((iVar4 + -1) % this->stride_d) + this->kernel_d;
    if (((iVar6 < 1) && (iVar3 < 1)) && (iVar2 < 1)) {
      return;
    }
    opt_b.lightmode = opt->lightmode;
    opt_b.use_shader_pack8 = opt->use_shader_pack8;
    opt_b.use_subgroup_ops = opt->use_subgroup_ops;
    opt_b.use_reserved_0 = opt->use_reserved_0;
    opt_b.num_threads = opt->num_threads;
    opt_b.workspace_allocator = opt->workspace_allocator;
    opt_b.openmp_blocktime = opt->openmp_blocktime;
    opt_b.use_winograd_convolution = opt->use_winograd_convolution;
    opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_b.use_int8_inference = opt->use_int8_inference;
    opt_b.use_vulkan_compute = opt->use_vulkan_compute;
    opt_b.use_bf16_storage = opt->use_bf16_storage;
    opt_b.use_fp16_packed = opt->use_fp16_packed;
    opt_b.use_fp16_storage = opt->use_fp16_storage;
    opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_b.use_int8_packed = opt->use_int8_packed;
    opt_b.use_int8_storage = opt->use_int8_storage;
    opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_b.use_packing_layout = opt->use_packing_layout;
    opt_b.vulkan_device_index = opt->vulkan_device_index;
    opt_b.use_reserved_1 = opt->use_reserved_1;
    opt_b.use_image_storage = opt->use_image_storage;
    opt_b.use_tensor_storage = opt->use_tensor_storage;
    opt_b.use_reserved_2 = opt->use_reserved_2;
    opt_b.flush_denormals = opt->flush_denormals;
    opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_b.use_shader_local_memory = opt->use_shader_local_memory;
    opt_b.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_b.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_b.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_b.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_b.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_b.use_fp16_uniform = opt->use_fp16_uniform;
    opt_b.use_int8_uniform = opt->use_int8_uniform;
    opt_b.use_reserved_9 = opt->use_reserved_9;
    opt_b.use_reserved_10 = opt->use_reserved_10;
    opt_b.use_reserved_11 = opt->use_reserved_11;
    opt_b.blob_allocator = opt->workspace_allocator;
    iVar7 = iVar3 / 2;
    iVar3 = iVar3 - iVar7;
    iVar5 = iVar6 / 2;
    iVar6 = iVar6 - iVar5;
    front = iVar2 / 2;
    iVar2 = iVar2 - front;
    break;
  case 3:
    iVar5 = ~((iVar7 + -1) % this->stride_w) + this->kernel_w;
    iVar7 = ~((iVar2 + -1) % this->stride_h) + this->kernel_h;
    iVar2 = ~((iVar4 + -1) % this->stride_d) + this->kernel_d;
    if (((iVar5 < 1) && (iVar7 < 1)) && (iVar2 < 1)) {
      return;
    }
    opt_b.lightmode = opt->lightmode;
    opt_b.use_shader_pack8 = opt->use_shader_pack8;
    opt_b.use_subgroup_ops = opt->use_subgroup_ops;
    opt_b.use_reserved_0 = opt->use_reserved_0;
    opt_b.num_threads = opt->num_threads;
    opt_b.workspace_allocator = opt->workspace_allocator;
    opt_b.openmp_blocktime = opt->openmp_blocktime;
    opt_b.use_winograd_convolution = opt->use_winograd_convolution;
    opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_b.use_int8_inference = opt->use_int8_inference;
    opt_b.use_vulkan_compute = opt->use_vulkan_compute;
    opt_b.use_bf16_storage = opt->use_bf16_storage;
    opt_b.use_fp16_packed = opt->use_fp16_packed;
    opt_b.use_fp16_storage = opt->use_fp16_storage;
    opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_b.use_int8_packed = opt->use_int8_packed;
    opt_b.use_int8_storage = opt->use_int8_storage;
    opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_b.use_packing_layout = opt->use_packing_layout;
    opt_b.vulkan_device_index = opt->vulkan_device_index;
    opt_b.use_reserved_1 = opt->use_reserved_1;
    opt_b.use_image_storage = opt->use_image_storage;
    opt_b.use_tensor_storage = opt->use_tensor_storage;
    opt_b.use_reserved_2 = opt->use_reserved_2;
    opt_b.flush_denormals = opt->flush_denormals;
    opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_b.use_shader_local_memory = opt->use_shader_local_memory;
    opt_b.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_b.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_b.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_b.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_b.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_b.use_fp16_uniform = opt->use_fp16_uniform;
    opt_b.use_int8_uniform = opt->use_int8_uniform;
    opt_b.use_reserved_9 = opt->use_reserved_9;
    opt_b.use_reserved_10 = opt->use_reserved_10;
    opt_b.use_reserved_11 = opt->use_reserved_11;
    opt_b.blob_allocator = opt->workspace_allocator;
    iVar3 = iVar7 / 2;
    iVar7 = iVar7 - iVar3;
    iVar6 = iVar5 / 2;
    iVar5 = iVar5 - iVar6;
    front = iVar2 / 2;
    iVar2 = iVar2 - front;
    break;
  default:
    goto switchD_00544606_default;
  }
  copy_make_border_3d(bottom_blob,bottom_blob_bordered,iVar7,iVar3,iVar5,iVar6,front,iVar2,0,v,
                      &opt_b);
switchD_00544606_default:
  return;
}

Assistant:

void Pooling3D::make_padding(const Mat& bottom_blob, Mat& bottom_blob_bordered, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;

    bottom_blob_bordered = bottom_blob;

    float pad_value = 0.f;
    if (pooling_type == PoolMethod_MAX)
    {
        pad_value = bottom_blob.elemsize == 1 ? -128.f : -FLT_MAX;
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        pad_value = 0.f;
    }

    int wtailpad = 0;
    int htailpad = 0;
    int dtailpad = 0;

    if (pad_mode == 0) // full padding
    {
        int wtail = (w + pad_left + pad_right - kernel_w) % stride_w;
        int htail = (h + pad_top + pad_bottom - kernel_h) % stride_h;
        int dtail = (d + pad_front + pad_behind - kernel_d) % stride_d;
        if (wtail != 0)
            wtailpad = stride_w - wtail;
        if (htail != 0)
            htailpad = stride_h - htail;
        if (dtail != 0)
            dtailpad = stride_d - dtail;

        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border_3d(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom + htailpad, pad_left, pad_right + wtailpad, pad_front, pad_behind + dtailpad, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_mode == 1) // valid padding
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border_3d(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, pad_front, pad_behind, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_mode == 2) // tensorflow padding=SAME or onnx padding=SAME_UPPER
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_h + (h - 1) / stride_h * stride_h - h;
        int dpad = kernel_d + (d - 1) / stride_d * stride_d - d;
        if (wpad > 0 || hpad > 0 || dpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border_3d(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, dpad / 2, dpad - dpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    else if (pad_mode == 3) // onnx padding=SAME_LOWER
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_h + (h - 1) / stride_h * stride_h - h;
        int dpad = kernel_d + (d - 1) / stride_d * stride_d - d;
        if (wpad > 0 || hpad > 0 || dpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border_3d(bottom_blob, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, dpad / 2, dpad - dpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
}